

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_write_indent(fy_emitter *emit,int indent)

{
  long lVar1;
  char *str;
  int len_00;
  fy_emitter *emit_00;
  _Bool _Var2;
  size_t __n;
  undefined8 uStack_30;
  char acStack_28 [4];
  int local_24;
  char *local_20;
  char *ws;
  int len;
  int indent_local;
  fy_emitter *emit_local;
  
  local_24 = indent;
  if (indent < 1) {
    local_24 = 0;
  }
  ws._4_4_ = local_24;
  uStack_30 = 0x134dd3;
  _len = emit;
  _Var2 = fy_emit_indentation(emit);
  if ((_Var2) && (_len->column <= ws._4_4_)) {
    if (_len->column != ws._4_4_) goto LAB_00134e11;
    uStack_30 = 0x134dfa;
    _Var2 = fy_emit_whitespace(_len);
    if (_Var2) goto LAB_00134e11;
  }
  uStack_30 = 0x134e11;
  fy_emit_putc(_len,fyewt_linebreak,10);
LAB_00134e11:
  if (_len->column < ws._4_4_) {
    ws._0_4_ = ws._4_4_ - _len->column;
    lVar1 = -((long)(int)ws + 0x10U & 0xfffffffffffffff0);
    __n = (size_t)(int)ws;
    local_20 = acStack_28 + lVar1;
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x134e57;
    memset(acStack_28 + lVar1,0x20,__n);
    emit_00 = _len;
    len_00 = (int)ws;
    str = local_20;
    local_20[(int)ws] = '\0';
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x134e78;
    fy_emit_write(emit_00,fyewt_indent,str,len_00);
  }
  _len->flags = _len->flags | 3;
  return;
}

Assistant:

void fy_emit_write_indent(struct fy_emitter *emit, int indent) {
    int len;
    char *ws;

    indent = indent > 0 ? indent : 0;

    if (!fy_emit_indentation(emit) || emit->column > indent ||
        (emit->column == indent && !fy_emit_whitespace(emit)))
        fy_emit_putc(emit, fyewt_linebreak, '\n');

    if (emit->column < indent) {
        len = indent - emit->column;
        ws = alloca(len + 1);
        memset(ws, ' ', len);
        ws[len] = '\0';
        fy_emit_write(emit, fyewt_indent, ws, len);
    }

    emit->flags |= FYEF_WHITESPACE | FYEF_INDENTATION;
}